

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int ipairsaux(lua_State *L)

{
  StkId pTVar1;
  lua_Integer lVar2;
  int iVar3;
  
  lVar2 = luaL_checkinteger(L,2);
  luaL_checktype(L,1,5);
  iVar3 = (int)lVar2 + 1;
  pTVar1 = L->top;
  (pTVar1->value).n = (double)iVar3;
  pTVar1->tt = 3;
  L->top = L->top + 1;
  lua_rawgeti(L,1,iVar3);
  iVar3 = lua_type(L,-1);
  return (uint)(iVar3 != 0) * 2;
}

Assistant:

static int ipairsaux(lua_State*L){
int i=luaL_checkint(L,2);
luaL_checktype(L,1,5);
i++;
lua_pushinteger(L,i);
lua_rawgeti(L,1,i);
return(lua_isnil(L,-1))?0:2;
}